

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool parser_match_newline(VrplibParser *p)

{
  int iVar1;
  int iVar2;
  
  parser_eat_whitespaces(p);
  iVar1 = p->curline;
  parser_eat_newline(p);
  iVar2 = p->curline;
  parser_eat_whitespaces(p);
  return iVar1 < iVar2;
}

Assistant:

static bool parser_match_newline(VrplibParser *p) {
    parser_eat_whitespaces(p);
    int32_t cache_curline = p->curline;
    parser_eat_newline(p);
    bool result = p->curline > cache_curline;
    parser_eat_whitespaces(p);
    return result;
}